

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManCutMatchOne(Nf_Man_t *p,int iObj,int *pCut,int *pCutSet)

{
  float fVar1;
  int iVar2;
  Vec_Wec_t *p_00;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Nf_Cfg_t NVar7;
  uint c_00;
  int iVar8;
  int iVar9;
  uint uVar10;
  Nf_Obj_t *pNVar11;
  int *piVar12;
  Vec_Int_t *p_01;
  Nf_Obj_t *pNVar13;
  Nf_Mat_t *pNVar14;
  Mio_Cell2_t *pMVar15;
  Nf_Mat_t (*paNVar16) [2];
  float local_f4;
  float AreaF;
  Nf_Mat_t *pA_1;
  Nf_Mat_t *pD_1;
  int Delay;
  int Required;
  int fCompl;
  Mio_Cell2_t *pC;
  Nf_Cfg_t Cfg;
  int Const;
  Nf_Obj_t *pBestF [6];
  Nf_Mat_t *pA;
  Nf_Mat_t *pD;
  int ArrivalA;
  int ArrivalD;
  int fComplF;
  int iFanin;
  int Offset;
  int Info;
  int c;
  int k;
  int i;
  Vec_Int_t *vArr;
  int fComplExt;
  int iFuncLit;
  int nFans;
  int *pFans;
  Nf_Obj_t *pBest;
  int *pCutSet_local;
  int *pCut_local;
  int iObj_local;
  Nf_Man_t *p_local;
  
  pNVar11 = Nf_ManObj(p,iObj);
  piVar12 = Nf_CutLeaves(pCut);
  uVar3 = Nf_CutSize(pCut);
  iVar4 = Nf_CutFunc(pCut);
  uVar5 = Abc_LitIsCompl(iVar4);
  p_00 = p->vTt2Match;
  iVar6 = Abc_Lit2Var(iVar4);
  p_01 = Vec_WecEntry(p_00,iVar6);
  for (c = 0; c < (int)uVar3; c = c + 1) {
    pNVar13 = Nf_ManObj(p,piVar12[c]);
    *(Nf_Obj_t **)(&stack0xffffffffffffff48 + (long)c * 8) = pNVar13;
  }
  if (uVar3 == 0) {
    if ((iVar4 != 0) && (iVar4 != 1)) {
      __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x45a,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
    }
    for (Offset = 0; Offset < 2; Offset = Offset + 1) {
      pNVar14 = Nf_ObjMatchD(p,iObj,Offset);
      pBestF[5] = (Nf_Obj_t *)Nf_ObjMatchA(p,iObj,Offset);
      ((Nf_Mat_t *)pBestF[5])->D = 0;
      pNVar14->D = 0;
      fVar1 = p->pCells[(int)(Offset ^ (uint)(iVar4 == 1))].AreaF;
      ((Nf_Mat_t *)pBestF[5])->F = fVar1;
      pNVar14->F = fVar1;
      uVar3 = Nf_CutHandle(pCutSet,pCut);
      pNVar11 = pBestF[5];
      *(uint *)pBestF[5]->M[0] = *(uint *)pBestF[5]->M[0] & 0xc00fffff | (uVar3 & 0x3ff) << 0x14;
      *(uint *)pNVar14 = *(uint *)pNVar14 & 0xc00fffff | (uVar3 & 0x3ff) << 0x14;
      uVar3 = (Offset ^ (uint)(iVar4 == 1)) & 0xfffff;
      *(uint *)pBestF[5]->M[0] = *(uint *)pBestF[5]->M[0] & 0xfff00000 | uVar3;
      *(uint *)pNVar14 = *(uint *)pNVar14 & 0xfff00000 | uVar3;
      NVar7 = Nf_Int2Cfg(0);
      pNVar11->M[0][0].Cfg = NVar7;
      pNVar14->Cfg = pNVar11->M[0][0].Cfg;
    }
  }
  else {
    for (c = 0; iVar4 = Vec_IntSize(p_01), c + 1 < iVar4; c = c + 2) {
      iVar4 = Vec_IntEntry(p_01,c);
      iVar6 = Vec_IntEntry(p_01,c + 1);
      NVar7 = Nf_Int2Cfg(iVar6);
      pMVar15 = Nf_ManCell(p,iVar4);
      c_00 = (uint)NVar7 & 1 ^ uVar5;
      iVar4 = Nf_ObjRequired(p,iObj,c_00);
      pD_1._4_4_ = 0;
      paNVar16 = pNVar11->M + (int)c_00;
      pNVar14 = pNVar11->M[(int)c_00] + 1;
      local_f4 = pMVar15->AreaF;
      if (uVar3 != *(uint *)&pMVar15->field_0x10 >> 0x1c) {
        __assert_fail("nFans == (int)pC->nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x472,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
      }
      for (Info = 0; Info < (int)uVar3; Info = Info + 1) {
        iVar8 = Nf_CfgVar(NVar7,Info);
        iVar9 = Nf_CfgCompl(NVar7,Info);
        iVar6 = *(int *)(*(long *)(&stack0xffffffffffffff48 + (long)iVar8 * 8) + (long)iVar9 * 0x20
                        + 8);
        iVar2 = *(int *)(*(long *)(&stack0xffffffffffffff48 + (long)iVar8 * 8) + (long)iVar9 * 0x20
                        + 0x18);
        if ((iVar4 < iVar2 + pMVar15->iDelays[Info]) || (iVar4 == 0x3fffffff)) {
          if (((*paNVar16)[0].D < 0x3fffffff) &&
             ((pNVar11->M[(int)c_00][1].D < 0x3fffffff && (iVar4 < iVar6 + pMVar15->iDelays[Info])))
             ) break;
          pD_1._4_4_ = Abc_MaxInt(pD_1._4_4_,iVar6 + pMVar15->iDelays[Info]);
          if ((1e+32 <= local_f4) ||
             (1e+32 <= *(float *)(*(long *)(&stack0xffffffffffffff48 + (long)iVar8 * 8) +
                                  (long)iVar9 * 0x20 + 0xc))) {
            local_f4 = 1e+32;
          }
          else {
            local_f4 = *(float *)(*(long *)(&stack0xffffffffffffff48 + (long)iVar8 * 8) +
                                  (long)iVar9 * 0x20 + 0xc) + local_f4;
          }
        }
        else {
          pD_1._4_4_ = Abc_MaxInt(pD_1._4_4_,iVar2 + pMVar15->iDelays[Info]);
          local_f4 = *(float *)(*(long *)(&stack0xffffffffffffff48 + (long)iVar8 * 8) +
                                (long)iVar9 * 0x20 + 0x1c) + local_f4;
        }
      }
      if ((int)uVar3 <= Info) {
        if (pD_1._4_4_ < (*paNVar16)[0].D) {
          (*paNVar16)[0].D = pD_1._4_4_;
          (*paNVar16)[0].F = local_f4;
          uVar10 = Nf_CutHandle(pCutSet,pCut);
          *(uint *)*paNVar16 = *(uint *)*paNVar16 & 0xc00fffff | (uVar10 & 0x3ff) << 0x14;
          *(uint *)*paNVar16 =
               *(uint *)*paNVar16 & 0xfff00000 | *(uint *)&pMVar15->field_0x10 & 0xfffff;
          (*paNVar16)[0].Cfg = NVar7;
          (*paNVar16)[0].Cfg = (Nf_Cfg_t)((uint)(*paNVar16)[0].Cfg & 0xfffffffe);
        }
        if (local_f4 + 0.001 < pNVar11->M[(int)c_00][1].F) {
          pNVar11->M[(int)c_00][1].D = pD_1._4_4_;
          pNVar11->M[(int)c_00][1].F = local_f4;
          uVar10 = Nf_CutHandle(pCutSet,pCut);
          *(uint *)pNVar14 = *(uint *)pNVar14 & 0xc00fffff | (uVar10 & 0x3ff) << 0x14;
          *(uint *)pNVar14 = *(uint *)pNVar14 & 0xfff00000 | *(uint *)&pMVar15->field_0x10 & 0xfffff
          ;
          pNVar11->M[(int)c_00][1].Cfg = NVar7;
          pNVar11->M[(int)c_00][1].Cfg = (Nf_Cfg_t)((uint)pNVar11->M[(int)c_00][1].Cfg & 0xfffffffe)
          ;
        }
      }
    }
  }
  return;
}

Assistant:

void Nf_ManCutMatchOne( Nf_Man_t * p, int iObj, int * pCut, int * pCutSet )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, c, Info, Offset, iFanin, fComplF;
    int ArrivalD, ArrivalA;
    Nf_Mat_t * pD, * pA;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        assert( iFuncLit == 0 || iFuncLit == 1 );
        for ( c = 0; c < 2; c++ )
        { 
            pD = Nf_ObjMatchD( p, iObj, c );
            pA = Nf_ObjMatchA( p, iObj, c );
            pD->D = pA->D = 0;
            pD->F = pA->F = p->pCells[c ^ Const].AreaF;
            pD->CutH = pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pA->Gate = c ^ Const;
//            pD->Conf = pA->Conf = 0;
            pD->Cfg = pA->Cfg = Nf_Int2Cfg(0);
        }
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        int Required   = Nf_ObjRequired( p, iObj, fCompl ), Delay = 0;
        Nf_Mat_t * pD  = &pBest->M[fCompl][0];
        Nf_Mat_t * pA  = &pBest->M[fCompl][1];
        float AreaF    = pC->AreaF;
        assert( nFans == (int)pC->nFanins );
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            ArrivalD  = pBestF[iFanin]->M[fComplF][0].D;
            ArrivalA  = pBestF[iFanin]->M[fComplF][1].D;
            if ( ArrivalA + pC->iDelays[k] <= Required && Required != SCL_INFINITY )
            {
                Delay = Abc_MaxInt( Delay, ArrivalA + pC->iDelays[k] );
                AreaF += pBestF[iFanin]->M[fComplF][1].F;
            }
            else 
            {
                if ( pD->D < SCL_INFINITY && pA->D < SCL_INFINITY && ArrivalD + pC->iDelays[k] > Required )
                    break;
                Delay = Abc_MaxInt( Delay, ArrivalD + pC->iDelays[k] );
                //AreaF += pBestF[iFanin]->M[fComplF][0].F;
                if ( AreaF >= (float)1e32 || pBestF[iFanin]->M[fComplF][0].F >= (float)1e32 )
                    AreaF = (float)1e32;
                else 
                    AreaF += pBestF[iFanin]->M[fComplF][0].F;
            }
        }
        if ( k < nFans )
            continue;
        // select best Cfgch
        if ( pD->D > Delay )
        {
            pD->D = Delay;
            pD->F = AreaF;
            pD->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pC->Id;
            pD->Cfg = Cfg;
            pD->Cfg.fCompl = 0;
        }

        if ( pA->F > AreaF + NF_EPSILON )
        {
            pA->D = Delay;
            pA->F = AreaF;
            pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pA->Gate = pC->Id;
            pA->Cfg = Cfg;
            pA->Cfg.fCompl = 0;
        }
    }
}